

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::UpsampleLayerParams::InternalSwap
          (UpsampleLayerParams *this,UpsampleLayerParams *other)

{
  int iVar1;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->scalingfactor_,&other->scalingfactor_);
  google::protobuf::RepeatedField<float>::InternalSwap
            (&this->fractionalscalingfactor_,&other->fractionalscalingfactor_);
  iVar1 = this->mode_;
  this->mode_ = other->mode_;
  other->mode_ = iVar1;
  iVar1 = this->linearupsamplemode_;
  this->linearupsamplemode_ = other->linearupsamplemode_;
  other->linearupsamplemode_ = iVar1;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void UpsampleLayerParams::InternalSwap(UpsampleLayerParams* other) {
  scalingfactor_.InternalSwap(&other->scalingfactor_);
  fractionalscalingfactor_.InternalSwap(&other->fractionalscalingfactor_);
  std::swap(mode_, other->mode_);
  std::swap(linearupsamplemode_, other->linearupsamplemode_);
  std::swap(_cached_size_, other->_cached_size_);
}